

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void deqp::gls::BuiltinPrecisionTests::
     ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doPrintIVal
               (FloatFormat *fmt,IVal *ival,ostream *os)

{
  undefined7 uVar1;
  long lVar2;
  long lVar3;
  Vector<tcu::Interval,_3> *pVVar4;
  IVal *pIVar5;
  bool bVar6;
  byte bVar7;
  undefined1 auStack_88 [8];
  IVal *local_80;
  IVal local_78;
  
  bVar7 = 0;
  local_80 = ival;
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  lVar3 = 0;
  do {
    if (lVar3 == 1) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
    }
    lVar2 = 0x10;
    do {
      auStack_88[lVar2] = 0;
      *(undefined8 *)((long)local_78.m_data + lVar2 + -8) = 0x7ff0000000000000;
      *(undefined8 *)(&local_78.m_data[0].m_hasNaN + lVar2) = 0xfff0000000000000;
      lVar2 = lVar2 + 0x18;
    } while (lVar2 != 0x58);
    pVVar4 = (local_80->m_data).m_data + lVar3;
    pIVar5 = &local_78;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      uVar1 = *(undefined7 *)&pVVar4->m_data[0].field_0x1;
      pIVar5->m_data[0].m_hasNaN = pVVar4->m_data[0].m_hasNaN;
      *(undefined7 *)&pIVar5->m_data[0].field_0x1 = uVar1;
      pVVar4 = (Vector<tcu::Interval,_3> *)((long)pVVar4 + ((ulong)bVar7 * -2 + 1) * 8);
      pIVar5 = (IVal *)((long)pIVar5 + ((ulong)bVar7 * -2 + 1) * 8);
    }
    ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doPrintIVal
              (fmt,&local_78,os);
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return;
}

Assistant:

static void			doPrintIVal		(const FloatFormat& fmt, const IVal ival, ostream& os)
	{
		os << "(";

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
		{
			if (ndx > 0)
				os << ", ";

			printIVal<Element>(fmt, ival[ndx], os);
		}

		os << ")";
	}